

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void vera::splitFacesFromHorizontalRow<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  ulong uVar1;
  int iVar2;
  CubemapFace<float> *pCVar3;
  float *pfVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iFace;
  long lVar10;
  
  uVar9 = _width / 6;
  iVar7 = (int)uVar9;
  uVar1 = ((ulong)(uint)(iVar7 * (int)_height) << 0x20) * 3;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)uVar1) {
    uVar6 = uVar1 >> 0x1e;
  }
  lVar10 = 0;
  do {
    pCVar3 = (CubemapFace<float> *)operator_new(0x18);
    pCVar3->id = 0;
    pCVar3->width = 0;
    pCVar3->height = 0;
    pCVar3->currentOffset = 0;
    pCVar3->data = (float *)0x0;
    _faces[lVar10] = pCVar3;
    pCVar3->id = (int)lVar10;
    pfVar4 = (float *)operator_new__(uVar6);
    pCVar3->data = pfVar4;
    pCVar3->width = iVar7;
    pCVar3->height = (int)_height;
    pCVar3->currentOffset = 0;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if (_height != 0) {
    iVar2 = 0;
    sVar5 = 0;
    do {
      lVar10 = 0;
      iVar8 = iVar2;
      do {
        pCVar3 = _faces[lVar10];
        if (pCVar3 != (CubemapFace<float> *)0x0) {
          memcpy(pCVar3->data + pCVar3->currentOffset,_data + iVar8,
                 (long)((uVar9 << 0x23) + (uVar9 << 0x22)) >> 0x20);
          pCVar3->currentOffset = pCVar3->currentOffset + iVar7 * 3;
        }
        lVar10 = lVar10 + 1;
        iVar8 = iVar8 + iVar7 * 3;
      } while (lVar10 != 6);
      sVar5 = sVar5 + 1;
      iVar2 = iVar2 + (int)_width * 3;
    } while (sVar5 != _height);
  }
  return;
}

Assistant:

void splitFacesFromHorizontalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 6;
    int faceHeight = _height;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        // int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 i      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[iFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}